

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc.cpp
# Opt level: O3

bool __thiscall
flatbuffers::FlatCompiler::RegisterCodeGenerator
          (FlatCompiler *this,FlatCOption *option,
          shared_ptr<flatbuffers::CodeGenerator> *code_generator)

{
  string *__rhs;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  _Base_ptr p_Var3;
  uint uVar4;
  iterator iVar5;
  mapped_type *pmVar6;
  _Rb_tree_node_base *p_Var7;
  size_type __n;
  size_type sVar8;
  long lVar9;
  _Rb_tree_node_base *p_Var10;
  bool bVar11;
  ulong uVar12;
  FlatCOption local_238;
  FlatCOption *local_1b8;
  FlatCOption local_1b0;
  FlatCOption local_130;
  FlatCOption local_b0;
  
  if ((option->short_opt)._M_string_length != 0) {
    std::operator+(&local_238.short_opt,"-",&option->short_opt);
    iVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>_>_>
                    *)this,&local_238.short_opt);
    paVar1 = &local_238.short_opt.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.short_opt._M_dataplus._M_p != paVar1) {
      operator_delete(local_238.short_opt._M_dataplus._M_p,
                      local_238.short_opt.field_2._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_header *)iVar5._M_node !=
        &(this->code_generators_)._M_t._M_impl.super__Rb_tree_header) {
      std::operator+(&local_238.short_opt,"multiple generators registered under: -",
                     &option->short_opt);
      (*(this->params_).error_fn)(this,&local_238.short_opt,false,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238.short_opt._M_dataplus._M_p == paVar1) {
        return false;
      }
      goto LAB_002fd07c;
    }
    if ((option->short_opt)._M_string_length != 0) {
      std::operator+(&local_238.short_opt,"-",&option->short_opt);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>_>_>
               ::operator[](&this->code_generators_,&local_238.short_opt);
      (pmVar6->super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (code_generator->
           super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(pmVar6->
                  super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount,
                 &(code_generator->
                  super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238.short_opt._M_dataplus._M_p != paVar1) {
        operator_delete(local_238.short_opt._M_dataplus._M_p,
                        local_238.short_opt.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if ((option->long_opt)._M_string_length != 0) {
    __rhs = &option->long_opt;
    local_1b8 = option;
    std::operator+(&local_238.short_opt,"--",__rhs);
    iVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>_>_>
                    *)this,&local_238.short_opt);
    paVar1 = &local_238.short_opt.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.short_opt._M_dataplus._M_p != paVar1) {
      operator_delete(local_238.short_opt._M_dataplus._M_p,
                      local_238.short_opt.field_2._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_header *)iVar5._M_node !=
        &(this->code_generators_)._M_t._M_impl.super__Rb_tree_header) {
      std::operator+(&local_238.short_opt,"multiple generators registered under: --",__rhs);
      (*(this->params_).error_fn)(this,&local_238.short_opt,false,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238.short_opt._M_dataplus._M_p == paVar1) {
        return false;
      }
LAB_002fd07c:
      operator_delete(local_238.short_opt._M_dataplus._M_p,
                      local_238.short_opt.field_2._M_allocated_capacity + 1);
      return false;
    }
    option = local_1b8;
    if ((local_1b8->long_opt)._M_string_length != 0) {
      std::operator+(&local_238.short_opt,"--",__rhs);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>_>_>
               ::operator[](&this->code_generators_,&local_238.short_opt);
      (pmVar6->super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (code_generator->
           super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(pmVar6->
                  super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount,
                 &(code_generator->
                  super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount);
      option = local_1b8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238.short_opt._M_dataplus._M_p != paVar1) {
        operator_delete(local_238.short_opt._M_dataplus._M_p,
                        local_238.short_opt.field_2._M_allocated_capacity + 1);
        option = local_1b8;
      }
    }
  }
  p_Var3 = (_Base_ptr)language_options._16_8_;
  if (language_options._16_8_ == 0) {
    p_Var10 = (_Rb_tree_node_base *)(language_options + 8);
LAB_002fd390:
    if (p_Var10 != (_Rb_tree_node_base *)language_options._24_8_) {
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var10);
      goto LAB_002fd3a8;
    }
  }
  else {
    do {
      p_Var7 = p_Var3;
      FlatCOption::FlatCOption(&local_238,option);
      FlatCOption::FlatCOption(&local_1b0,(FlatCOption *)(p_Var7 + 1));
      sVar2 = local_1b0.long_opt._M_string_length;
      sVar8 = local_238.long_opt._M_string_length;
      __n = local_238.long_opt._M_string_length;
      if (local_1b0.long_opt._M_string_length < local_238.long_opt._M_string_length) {
        __n = local_1b0.long_opt._M_string_length;
      }
      if ((__n == 0) ||
         (uVar4 = memcmp(local_238.long_opt._M_dataplus._M_p,local_1b0.long_opt._M_dataplus._M_p,__n
                        ), uVar4 == 0)) {
        lVar9 = sVar8 - sVar2;
        if (lVar9 < -0x7fffffff) {
          lVar9 = -0x80000000;
        }
        if (0x7ffffffe < lVar9) {
          lVar9 = 0x7fffffff;
        }
        uVar4 = (uint)lVar9;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0.description._M_dataplus._M_p != &local_1b0.description.field_2) {
        operator_delete(local_1b0.description._M_dataplus._M_p,
                        local_1b0.description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0.parameter._M_dataplus._M_p != &local_1b0.parameter.field_2) {
        operator_delete(local_1b0.parameter._M_dataplus._M_p,
                        local_1b0.parameter.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0.long_opt._M_dataplus._M_p != &local_1b0.long_opt.field_2) {
        operator_delete(local_1b0.long_opt._M_dataplus._M_p,
                        local_1b0.long_opt.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0.short_opt._M_dataplus._M_p != &local_1b0.short_opt.field_2) {
        operator_delete(local_1b0.short_opt._M_dataplus._M_p,
                        local_1b0.short_opt.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238.description._M_dataplus._M_p != &local_238.description.field_2) {
        operator_delete(local_238.description._M_dataplus._M_p,
                        local_238.description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238.parameter._M_dataplus._M_p != &local_238.parameter.field_2) {
        operator_delete(local_238.parameter._M_dataplus._M_p,
                        local_238.parameter.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238.long_opt._M_dataplus._M_p != &local_238.long_opt.field_2) {
        operator_delete(local_238.long_opt._M_dataplus._M_p,
                        local_238.long_opt.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238.short_opt._M_dataplus._M_p != &local_238.short_opt.field_2) {
        operator_delete(local_238.short_opt._M_dataplus._M_p,
                        local_238.short_opt.field_2._M_allocated_capacity + 1);
      }
      p_Var3 = (&p_Var7->_M_left)[~uVar4 >> 0x1f];
    } while ((&p_Var7->_M_left)[~uVar4 >> 0x1f] != (_Base_ptr)0x0);
    p_Var10 = p_Var7;
    if ((int)uVar4 < 0) goto LAB_002fd390;
LAB_002fd3a8:
    FlatCOption::FlatCOption(&local_b0,(FlatCOption *)(p_Var7 + 1));
    FlatCOption::FlatCOption(&local_130,option);
    sVar8 = local_b0.long_opt._M_string_length;
    if (local_130.long_opt._M_string_length < local_b0.long_opt._M_string_length) {
      sVar8 = local_130.long_opt._M_string_length;
    }
    if (sVar8 == 0) {
LAB_002fd407:
      uVar12 = 0xffffffff80000000;
      if (-0x80000000 <
          (long)(local_b0.long_opt._M_string_length - local_130.long_opt._M_string_length)) {
        uVar12 = local_b0.long_opt._M_string_length - local_130.long_opt._M_string_length;
      }
      if (0x7ffffffe < (long)uVar12) {
        uVar12 = 0x7fffffff;
      }
    }
    else {
      uVar4 = memcmp(local_b0.long_opt._M_dataplus._M_p,local_130.long_opt._M_dataplus._M_p,sVar8);
      uVar12 = (ulong)uVar4;
      if (uVar4 == 0) goto LAB_002fd407;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130.description._M_dataplus._M_p != &local_130.description.field_2) {
      operator_delete(local_130.description._M_dataplus._M_p,
                      local_130.description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130.parameter._M_dataplus._M_p != &local_130.parameter.field_2) {
      operator_delete(local_130.parameter._M_dataplus._M_p,
                      local_130.parameter.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130.long_opt._M_dataplus._M_p != &local_130.long_opt.field_2) {
      operator_delete(local_130.long_opt._M_dataplus._M_p,
                      local_130.long_opt.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130.short_opt._M_dataplus._M_p != &local_130.short_opt.field_2) {
      operator_delete(local_130.short_opt._M_dataplus._M_p,
                      local_130.short_opt.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.description._M_dataplus._M_p != &local_b0.description.field_2) {
      operator_delete(local_b0.description._M_dataplus._M_p,
                      local_b0.description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.parameter._M_dataplus._M_p != &local_b0.parameter.field_2) {
      operator_delete(local_b0.parameter._M_dataplus._M_p,
                      local_b0.parameter.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.long_opt._M_dataplus._M_p != &local_b0.long_opt.field_2) {
      operator_delete(local_b0.long_opt._M_dataplus._M_p,
                      local_b0.long_opt.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.short_opt._M_dataplus._M_p != &local_b0.short_opt.field_2) {
      operator_delete(local_b0.short_opt._M_dataplus._M_p,
                      local_b0.short_opt.field_2._M_allocated_capacity + 1);
    }
    if (-1 < (int)uVar12) {
      return true;
    }
  }
  if (p_Var10 == (_Rb_tree_node_base *)(language_options + 8)) {
    bVar11 = true;
    goto LAB_002fd6b7;
  }
  FlatCOption::FlatCOption(&local_238,option);
  FlatCOption::FlatCOption(&local_1b0,(FlatCOption *)(p_Var10 + 1));
  sVar8 = local_238.long_opt._M_string_length;
  if (local_1b0.long_opt._M_string_length < local_238.long_opt._M_string_length) {
    sVar8 = local_1b0.long_opt._M_string_length;
  }
  if (sVar8 == 0) {
LAB_002fd59d:
    uVar12 = 0xffffffff80000000;
    if (-0x80000000 <
        (long)(local_238.long_opt._M_string_length - local_1b0.long_opt._M_string_length)) {
      uVar12 = local_238.long_opt._M_string_length - local_1b0.long_opt._M_string_length;
    }
    if (0x7ffffffe < (long)uVar12) {
      uVar12 = 0;
    }
  }
  else {
    uVar4 = memcmp(local_238.long_opt._M_dataplus._M_p,local_1b0.long_opt._M_dataplus._M_p,sVar8);
    uVar12 = (ulong)uVar4;
    if (uVar4 == 0) goto LAB_002fd59d;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0.description._M_dataplus._M_p != &local_1b0.description.field_2) {
    operator_delete(local_1b0.description._M_dataplus._M_p,
                    local_1b0.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0.parameter._M_dataplus._M_p != &local_1b0.parameter.field_2) {
    operator_delete(local_1b0.parameter._M_dataplus._M_p,
                    local_1b0.parameter.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0.long_opt._M_dataplus._M_p != &local_1b0.long_opt.field_2) {
    operator_delete(local_1b0.long_opt._M_dataplus._M_p,
                    local_1b0.long_opt.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0.short_opt._M_dataplus._M_p != &local_1b0.short_opt.field_2) {
    operator_delete(local_1b0.short_opt._M_dataplus._M_p,
                    local_1b0.short_opt.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238.description._M_dataplus._M_p != &local_238.description.field_2) {
    operator_delete(local_238.description._M_dataplus._M_p,
                    local_238.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238.parameter._M_dataplus._M_p != &local_238.parameter.field_2) {
    operator_delete(local_238.parameter._M_dataplus._M_p,
                    local_238.parameter.field_2._M_allocated_capacity + 1);
  }
  bVar11 = (bool)((byte)(uVar12 >> 0x1f) & 1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238.long_opt._M_dataplus._M_p != &local_238.long_opt.field_2) {
    operator_delete(local_238.long_opt._M_dataplus._M_p,
                    local_238.long_opt.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238.short_opt._M_dataplus._M_p != &local_238.short_opt.field_2) {
    operator_delete(local_238.short_opt._M_dataplus._M_p,
                    local_238.short_opt.field_2._M_allocated_capacity + 1);
  }
LAB_002fd6b7:
  p_Var7 = (_Rb_tree_node_base *)operator_new(0xa0);
  FlatCOption::FlatCOption((FlatCOption *)(p_Var7 + 1),option);
  std::_Rb_tree_insert_and_rebalance
            (bVar11,p_Var7,p_Var10,(_Rb_tree_node_base *)(language_options + 8));
  language_options._40_8_ = language_options._40_8_ + 1;
  return true;
}

Assistant:

bool FlatCompiler::RegisterCodeGenerator(
    const FlatCOption &option, std::shared_ptr<CodeGenerator> code_generator) {
  if (!option.short_opt.empty() &&
      code_generators_.find("-" + option.short_opt) != code_generators_.end()) {
    Error("multiple generators registered under: -" + option.short_opt, false,
          false);
    return false;
  }

  if (!option.short_opt.empty()) {
    code_generators_["-" + option.short_opt] = code_generator;
  }

  if (!option.long_opt.empty() &&
      code_generators_.find("--" + option.long_opt) != code_generators_.end()) {
    Error("multiple generators registered under: --" + option.long_opt, false,
          false);
    return false;
  }

  if (!option.long_opt.empty()) {
    code_generators_["--" + option.long_opt] = code_generator;
  }

  language_options.insert(option);

  return true;
}